

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O1

int MPIABI_Wait(MPIABI_Request *request,MPIABI_Status *status)

{
  undefined8 uVar1;
  int iVar2;
  MPI_Status *mpi_status_ptr;
  
  iVar2 = MPI_Wait();
  if (status != (MPIABI_Status *)0x0) {
    status->MPI_SOURCE = (status->mpi_status).status_OpenMPI.f0;
    uVar1 = *(undefined8 *)((long)&status->mpi_status + 4);
    status->MPI_TAG = (int)uVar1;
    status->MPI_ERROR = (int)((ulong)uVar1 >> 0x20);
  }
  return iVar2;
}

Assistant:

int MPIABI_Wait(
  MPIABI_Request * request,
  MPIABI_Status * status
) {
  return MPI_Wait(
    (MPI_Request *)(WPI_RequestPtr)request,
    (MPI_Status *)(WPI_StatusPtr)status
  );
}